

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanDirective(Scanner *this)

{
  iterator pcVar1;
  iterator pcVar2;
  size_t sVar3;
  iterator pcVar4;
  bool bVar5;
  bool local_289;
  undefined1 local_1c8 [8];
  Token T;
  StringRef Name;
  iterator NameStart;
  iterator Start;
  Scanner *this_local;
  iterator local_b8;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  iterator local_88;
  size_t local_80;
  iterator *local_78;
  char *local_70;
  size_t local_68;
  iterator *local_60;
  char *local_58;
  size_t local_50;
  size_t local_48;
  char *local_40;
  iterator local_38;
  int local_2c;
  size_t local_28;
  char *local_20;
  iterator local_18;
  int local_c;
  
  unrollIndent(this,-1);
  SmallVectorImpl<(anonymous_namespace)::SimpleKey>::clear
            (&(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>);
  this->IsSimpleKeyAllowed = false;
  pcVar1 = this->Current;
  consume(this,0x25);
  pcVar4 = this->Current;
  pcVar2 = skip_while(this,0x28df80,(iterator)0x0);
  this->Current = pcVar2;
  sVar3 = (long)this->Current - (long)pcVar4;
  T.Value.field_2._8_8_ = skip_s_white;
  pcVar2 = skip_while(this,0x28df20,(iterator)0x0);
  this->Current = pcVar2;
  Token::Token((Token *)local_1c8);
  local_a0 = strlen("YAML");
  local_98 = "YAML";
  local_a8 = "YAML";
  local_70 = "YAML";
  local_78 = &local_88;
  local_289 = false;
  local_90 = local_a0;
  local_88 = pcVar4;
  local_80 = sVar3;
  local_68 = local_a0;
  if (sVar3 == local_a0) {
    local_20 = "YAML";
    local_28 = local_a0;
    local_18 = pcVar4;
    if (local_a0 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(pcVar4,"YAML",local_a0);
    }
    local_289 = local_c == 0;
  }
  if (local_289) {
    pcVar4 = skip_while(this,0x28df80,(iterator)0x0);
    this->Current = pcVar4;
    local_1c8._0_4_ = TK_VersionDirective;
    T.Range.Data = this->Current + -(long)pcVar1;
    T._0_8_ = pcVar1;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)local_1c8);
    this_local._7_1_ = true;
  }
  else {
    local_50 = strlen("TAG");
    local_58 = "TAG";
    local_60 = &local_b8;
    bVar5 = false;
    local_b8 = pcVar4;
    local_b0 = sVar3;
    if (sVar3 == local_50) {
      local_40 = "TAG";
      local_48 = local_50;
      local_38 = pcVar4;
      if (local_50 == 0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(pcVar4,"TAG",local_50);
      }
      bVar5 = local_2c == 0;
    }
    if (bVar5) {
      pcVar4 = skip_while(this,0x28df80,(iterator)0x0);
      this->Current = pcVar4;
      pcVar4 = skip_while(this,0x28df20,(iterator)0x0);
      this->Current = pcVar4;
      pcVar4 = skip_while(this,0x28df80,(iterator)0x0);
      this->Current = pcVar4;
      local_1c8._0_4_ = TK_TagDirective;
      T.Range.Data = this->Current + -(long)pcVar1;
      T._0_8_ = pcVar1;
      AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
      ::push_back(&this->TokenQueue,(Token *)local_1c8);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  Token::~Token((Token *)local_1c8);
  return this_local._7_1_;
}

Assistant:

bool Scanner::scanDirective() {
  // Reset the indentation level.
  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  StringRef::iterator Start = Current;
  consume('%');
  StringRef::iterator NameStart = Current;
  Current = skip_while(&Scanner::skip_ns_char, Current);
  StringRef Name(NameStart, Current - NameStart);
  Current = skip_while(&Scanner::skip_s_white, Current);

  Token T;
  if (Name == "YAML") {
    Current = skip_while(&Scanner::skip_ns_char, Current);
    T.Kind = Token::TK_VersionDirective;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    return true;
  } else if(Name == "TAG") {
    Current = skip_while(&Scanner::skip_ns_char, Current);
    Current = skip_while(&Scanner::skip_s_white, Current);
    Current = skip_while(&Scanner::skip_ns_char, Current);
    T.Kind = Token::TK_TagDirective;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    return true;
  }
  return false;
}